

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformanceTesting.cpp
# Opt level: O3

void shortestPathPerfTest
               (Graph<std::pair<double,_double>_> *graph,function<Path_(int,_int)> *spAlgorithm,
               char test)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ostream *poVar7;
  undefined8 uVar8;
  double dVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int num_iter;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  map;
  int local_d4;
  double local_d0;
  int local_c8;
  int local_c4;
  undefined1 local_c0 [56];
  _Any_data *local_88;
  Graph<std::pair<double,_double>_> *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  Path local_50;
  
  local_c0._0_8_ = local_c0 + 0x10;
  local_80 = graph;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"Number of iterations: ","");
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/../Graph/../Utils/Utils.h:20:90)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/../Graph/../Utils/Utils.h:20:90)>
             ::_M_manager;
  getOption(&local_d4,(string *)local_c0,(function<bool_(int)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
  lVar12 = 0x7fffffffffffffff;
  iVar13 = 0;
  if (local_d4 < 1) {
    lVar11 = 0;
  }
  else {
    lVar11 = 0;
    dVar9 = 0.0;
    local_88 = (_Any_data *)spAlgorithm;
    do {
      local_d0 = dVar9;
      Graph<std::pair<double,_double>_>::getVertexMap
                ((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  *)local_c0,local_80);
      puVar1 = (undefined8 *)local_c0._16_8_;
      iVar3 = rand();
      puVar2 = (undefined8 *)local_c0._16_8_;
      for (uVar10 = (ulong)(long)iVar3 % (ulong)local_c0._24_8_; uVar10 != 0; uVar10 = uVar10 - 1) {
        puVar1 = (undefined8 *)*puVar1;
      }
      iVar3 = *(int *)(puVar1 + 1);
      iVar4 = rand();
      for (uVar10 = (ulong)(long)iVar4 % (ulong)local_c0._24_8_; uVar10 != 0; uVar10 = uVar10 - 1) {
        puVar2 = (undefined8 *)*puVar2;
      }
      iVar4 = *(int *)(puVar2 + 1);
      lVar5 = std::chrono::_V2::system_clock::now();
      local_c8 = iVar4;
      local_c4 = iVar3;
      if (*(long *)(local_88 + 1) == 0) {
        uVar8 = std::__throw_bad_function_call();
        __clang_call_terminate(uVar8);
      }
      (**(code **)(local_88->_M_pod_data + 0x18))(&local_50,local_88,&local_c4,&local_c8);
      if (local_50.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_50.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      lVar6 = std::chrono::_V2::system_clock::now();
      dVar9 = (double)((lVar6 - lVar5) / 1000);
      lVar11 = lVar11 + (long)dVar9;
      if ((long)dVar9 < lVar12) {
        lVar12 = (long)dVar9;
      }
      if ((long)dVar9 < (long)local_d0) {
        dVar9 = local_d0;
      }
      std::
      _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_c0);
      iVar13 = iVar13 + 1;
    } while (iVar13 < local_d4);
  }
  local_d0 = (double)lVar11 / (double)local_d4;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Minimum run time: ",0x12);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Maximum run time: ",0x12);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Average run time: ",0x12);
  poVar7 = std::ostream::_M_insert<double>(local_d0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total run time: ",0x10);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  local_c0._0_8_ = local_c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"ENTER to go back","");
  enterWait((string *)local_c0);
  if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
  return;
}

Assistant:

void shortestPathPerfTest(Graph<coordinates> &graph, const function<Path (int, int)> &spAlgorithm, char test) {
    int id_src, id_dest, num_iter;
    getOption(num_iter, "Number of iterations: ");

    long total = 0, min_d = LONG_MAX, max_d = 0;

    for (int i = 0; i < num_iter; i++) {
        auto map = graph.getVertexMap();
        auto iter = map.begin();
        advance(iter, rand() % map.size());
        id_src = iter->first;
        iter = map.begin();
        advance(iter, rand() % map.size());
        id_dest = iter->first;
        auto start = high_resolution_clock::now();
        spAlgorithm(id_src, id_dest);
        auto stop = high_resolution_clock::now();
        auto duration = duration_cast<microseconds>(stop - start);
        total += duration.count();
        min_d = min(min_d, (long) duration.count());
        max_d = max(max_d, (long) duration.count());
    }

    double average = (double) total / (double) num_iter;

    cout << "Minimum run time: " << min_d << endl;
    cout << "Maximum run time: " << max_d << endl;
    cout << "Average run time: " << average << endl;
    cout << "Total run time: " << total << endl;

    enterWait();
}